

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_hex4.c
# Opt level: O2

void parse_hex4_should_parse_all_combinations(void)

{
  long lVar1;
  int iVar2;
  uint uVar3;
  ulong expected;
  long in_FS_OFFSET;
  uchar digits_upper [6];
  uchar digits_lower [6];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  for (expected = 0; expected != 0x10000; expected = expected + 1) {
    iVar2 = sprintf((char *)digits_lower,"%.4x",expected & 0xffffffff);
    UnityAssertEqualNumber(4,(long)iVar2,"sprintf failed.",0x27,UNITY_DISPLAY_STYLE_INT);
    iVar2 = sprintf((char *)digits_upper,"%.4X",expected & 0xffffffff);
    UnityAssertEqualNumber(4,(long)iVar2,"sprintf failed.",0x28,UNITY_DISPLAY_STYLE_INT);
    uVar3 = parse_hex4(digits_lower);
    UnityAssertEqualNumber
              (expected,(ulong)uVar3,"Failed to parse lowercase digits.",0x2a,
               UNITY_DISPLAY_STYLE_INT);
    uVar3 = parse_hex4(digits_upper);
    UnityAssertEqualNumber
              (expected,(ulong)uVar3,"Failed to parse uppercase digits.",0x2b,
               UNITY_DISPLAY_STYLE_INT);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void parse_hex4_should_parse_all_combinations(void)
{
    unsigned int number = 0;
    unsigned char digits_lower[6];
    unsigned char digits_upper[6];
    /* test all combinations */
    for (number = 0; number <= 0xFFFF; number++)
    {
        TEST_ASSERT_EQUAL_INT_MESSAGE(4, sprintf((char*)digits_lower, "%.4x", number), "sprintf failed.");
        TEST_ASSERT_EQUAL_INT_MESSAGE(4, sprintf((char*)digits_upper, "%.4X", number), "sprintf failed.");

        TEST_ASSERT_EQUAL_INT_MESSAGE(number, parse_hex4(digits_lower), "Failed to parse lowercase digits.");
        TEST_ASSERT_EQUAL_INT_MESSAGE(number, parse_hex4(digits_upper), "Failed to parse uppercase digits.");
    }
}